

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV extractObjectInformation
                (CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_CLASS *objClass,
                CK_KEY_TYPE *keyType,CK_CERTIFICATE_TYPE *certType,CK_BBOOL *isOnToken,
                CK_BBOOL *isPrivate,bool bImplicit)

{
  CK_ATTRIBUTE_TYPE CVar1;
  CK_OBJECT_CLASS CVar2;
  CK_RV CVar3;
  byte bVar4;
  bool bVar5;
  unsigned_long *puVar6;
  bool bVar7;
  byte bVar8;
  
  if (ulCount == 0) {
    if (bImplicit) {
      return 0;
    }
    return 0xd0;
  }
  puVar6 = &pTemplate->ulValueLen;
  bVar7 = false;
  bVar4 = 0;
  bVar5 = false;
  bVar8 = 0;
  do {
    CVar1 = ((_CK_ATTRIBUTE *)(puVar6 + -2))->type;
    if ((long)CVar1 < 2) {
      if (CVar1 == 0) {
        if (*puVar6 == 8) {
          *objClass = *(CK_OBJECT_CLASS *)puVar6[-1];
          bVar8 = 1;
        }
      }
      else if ((CVar1 == 1) && (*puVar6 == 1)) {
        *isOnToken = *(CK_BBOOL *)puVar6[-1];
      }
    }
    else if (CVar1 == 2) {
      if (*puVar6 == 1) {
        *isPrivate = *(CK_BBOOL *)puVar6[-1];
        bVar7 = true;
      }
    }
    else if (CVar1 == 0x80) {
      if (*puVar6 == 8) {
        *certType = *(CK_CERTIFICATE_TYPE *)puVar6[-1];
        bVar4 = 1;
      }
    }
    else if ((CVar1 == 0x100) && (*puVar6 == 8)) {
      *keyType = *(CK_KEY_TYPE *)puVar6[-1];
      bVar5 = true;
    }
    puVar6 = puVar6 + 3;
    ulCount = ulCount - 1;
  } while (ulCount != 0);
  CVar3 = 0xd0;
  if (bImplicit) {
    CVar3 = 0;
  }
  if (((~bVar8 | bImplicit) & 1) != 0) {
    return CVar3;
  }
  CVar2 = *objClass;
  if (CVar2 - 2 < 3) {
    if (!bVar5) {
      return 0xd0;
    }
    if (CVar2 != 2 || bVar7) {
      return 0;
    }
  }
  else {
    bVar5 = (bool)(bVar4 & CVar2 == 1);
    CVar3 = 0xd0;
    if (bVar5 == (CVar2 == 1)) {
      CVar3 = 0;
    }
    if ((~bVar5 & 1U) != 0 || bVar7) {
      return CVar3;
    }
    *isPrivate = '\0';
    if (*objClass != 2) {
      return 0;
    }
  }
  *isPrivate = '\0';
  return 0;
}

Assistant:

static CK_RV extractObjectInformation(CK_ATTRIBUTE_PTR pTemplate,
				      CK_ULONG ulCount,
				      CK_OBJECT_CLASS &objClass,
				      CK_KEY_TYPE &keyType,
				      CK_CERTIFICATE_TYPE &certType,
				      CK_BBOOL &isOnToken,
				      CK_BBOOL &isPrivate,
				      bool bImplicit)
{
	bool bHasClass = false;
	bool bHasKeyType = false;
	bool bHasCertType = false;
	bool bHasPrivate = false;

	// Extract object information
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
				if (pTemplate[i].ulValueLen == sizeof(CK_OBJECT_CLASS))
				{
					objClass = *(CK_OBJECT_CLASS_PTR)pTemplate[i].pValue;
					bHasClass = true;
				}
				break;
			case CKA_KEY_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_KEY_TYPE))
				{
					keyType = *(CK_KEY_TYPE*)pTemplate[i].pValue;
					bHasKeyType = true;
				}
				break;
			case CKA_CERTIFICATE_TYPE:
				if (pTemplate[i].ulValueLen == sizeof(CK_CERTIFICATE_TYPE))
				{
					certType = *(CK_CERTIFICATE_TYPE*)pTemplate[i].pValue;
					bHasCertType = true;
				}
				break;
			case CKA_TOKEN:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
				}
				break;
			case CKA_PRIVATE:
				if (pTemplate[i].ulValueLen == sizeof(CK_BBOOL))
				{
					isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
					bHasPrivate = true;
				}
				break;
			default:
				break;
		}
	}

	if (bImplicit)
	{
		return CKR_OK;
	}

	if (!bHasClass)
	{
		return CKR_TEMPLATE_INCOMPLETE;
	}

	bool bKeyTypeRequired = (objClass == CKO_PUBLIC_KEY || objClass == CKO_PRIVATE_KEY || objClass == CKO_SECRET_KEY);
	if (bKeyTypeRequired && !bHasKeyType)
	{
		 return CKR_TEMPLATE_INCOMPLETE;
	}

	if (objClass == CKO_CERTIFICATE)
	{
		if (!bHasCertType)
		{
			return CKR_TEMPLATE_INCOMPLETE;
		}
		if (!bHasPrivate)
		{
			// Change default value for certificates
			isPrivate = CK_FALSE;
		}
	}

	if (objClass == CKO_PUBLIC_KEY && !bHasPrivate)
	{
		// Change default value for public keys
		isPrivate = CK_FALSE;
	}

	return CKR_OK;
}